

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

int os_gets_timeout(uchar *buf,size_t bufl,unsigned_long timeout,int use_timeout)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  undefined1 *puVar7;
  int *piVar8;
  os_event_info_t event_info;
  os_event_info_t local_130;
  
  if (os_f_plain == 0) {
    os_gets_begin(bufl);
    lVar4 = os_get_sys_clock_ms();
    if (S_default_win != (osgen_txtwin_t *)0x0) {
      lVar4 = lVar4 + timeout;
      do {
        if (use_timeout != 0) {
          lVar5 = os_get_sys_clock_ms();
          timeout = lVar4 - lVar5;
          if (timeout != 0 && lVar5 <= lVar4) goto LAB_001e73ca;
          iVar1 = 2;
LAB_001e7456:
          puVar7 = &S_special_cursor_pos;
          goto LAB_001e745d;
        }
LAB_001e73ca:
        piVar6 = &(S_sbmode_win->base).winy;
        piVar8 = &(S_sbmode_win->base).winx;
        if (S_sbmode_win == (osgen_txtwin_t *)0x0) {
          piVar8 = &S_gets_x;
          piVar6 = &S_gets_y;
        }
        ossloc(*piVar6,*piVar8);
        iVar1 = os_get_event(timeout,use_timeout,&local_130);
        if ((iVar1 == 2) || (iVar1 == 4)) goto LAB_001e7456;
        if (iVar1 == 5) {
          S_special_cursor_pos = 0;
          iVar1 = 5;
          goto LAB_001e7448;
        }
        iVar1 = os_gets_process(iVar1,&local_130);
      } while (iVar1 == 0);
      strcpy((char *)buf,S_gets_internal_buf);
      S_gets_internal_buf[0] = '\0';
      iVar1 = 6;
LAB_001e7448:
      puVar7 = &S_gets_in_progress;
LAB_001e745d:
      *puVar7 = 0;
      return iVar1;
    }
  }
  else {
    fflush(_stdout);
    if (use_timeout != 0) {
      return 4;
    }
    pcVar2 = fgets((char *)buf,(int)bufl,_stdin);
    if (pcVar2 != (char *)0x0) {
      sVar3 = strlen((char *)buf);
      if (sVar3 == 0) {
        return 6;
      }
      if (buf[sVar3 - 1] != '\n') {
        return 6;
      }
      buf[sVar3 - 1] = '\0';
      return 6;
    }
  }
  return 5;
}

Assistant:

int os_gets_timeout(unsigned char *buf, size_t bufl,
                    unsigned long timeout, int use_timeout)
{
    long end_time;
    osgen_txtwin_t *win;
    
    /* if we're in 'plain' mode, simply use stdio input */
    if (os_f_plain)
    {
        size_t len;

        /* make sure the standard output is flushed */
        fflush(stdout);

        /* we don't support the timeout feature in plain mode */
        if (use_timeout)
            return OS_EVT_NOTIMEOUT;

        /* 
         *   get input from stdio, and translate the result code - if gets()
         *   returns null, it indicates an error of some kind, so return an
         *   end-of-file indication 
         */
        if (fgets((char *)buf, bufl, stdin) == 0)
            return OS_EVT_EOF;

        /* remove the trailing newline from the buffer, if present */
        if ((len = strlen((char *)buf)) != 0 && buf[len-1] == '\n')
            buf[len-1] = '\0';

        /* indicate that we read a line */
        return OS_EVT_LINE;
    }

    /* begin input editing mode */
    os_gets_begin(bufl);

    /*
     *   If we have a timeout, calculate the system clock time at which the
     *   timeout expires.  This is simply the current system clock time plus
     *   the timeout interval.  Since we might need to process a series of
     *   events, we'll need to know how much time remains at each point we
     *   get a new event.  
     */
    end_time = os_get_sys_clock_ms() + timeout;
    
    /* use the default window for input */
    if ((win = S_default_win) == 0)
        return OS_EVT_EOF;

    /* process keystrokes until we're done entering the command */
    for ( ;; )
    {
        int event_type;
        os_event_info_t event_info;
        
        /* if we're using a timeout, check for expiration */
        if (use_timeout)
        {
            long cur_clock;

            /* note the current system clock time */
            cur_clock = os_get_sys_clock_ms();

            /* 
             *   if we're past the timeout expiration time already,
             *   interrupt with timeout now 
             */
            if (cur_clock >= end_time)
                goto timeout_expired;

            /* note the interval remaining to the timeout expiration */
            timeout = end_time - cur_clock;
        }
        
        /* move to the proper position on the screen before pausing */
        if (S_sbmode_win != 0)
            ossloc(S_sbmode_win->base.winy, S_sbmode_win->base.winx);
        else
            ossloc(S_gets_y, S_gets_x);

        /* get an event */
        event_type = os_get_event(timeout, use_timeout, &event_info);

        /* handle the event according to the event type */
        switch(event_type)
        {
        case OS_EVT_TIMEOUT:
        timeout_expired:
            /* done with the overridden cursor position */
            S_special_cursor_pos = FALSE;

            /* return the timeout status to the caller */
            return OS_EVT_TIMEOUT;

        case OS_EVT_NOTIMEOUT:
            /* 
             *   we can't handle events with timeouts, so we can't provide
             *   line reading with timeouts, either
             */
            S_special_cursor_pos = FALSE;
            return OS_EVT_NOTIMEOUT;

        case OS_EVT_EOF:
            /* end of file - end input and return the EOF to our caller */
            S_special_cursor_pos = FALSE;
            S_gets_in_progress = FALSE;
            return OS_EVT_EOF;

        default:
            /* process anything else through the input line editor */
            if (os_gets_process(event_type, &event_info))
            {
                /* 
                 *   Copy the result to the caller's buffer.  Note that we
                 *   know the result will fit, because we always limit the
                 *   editing process to the caller's buffer size.  
                 */
                strcpy((char *)buf, S_gets_buf);

                /* clear the input buffer */
                S_gets_buf[0] = '\0';

                /* input is no longer in progress */
                S_gets_in_progress = FALSE;

                /* return success */
                return OS_EVT_LINE;
            }
            break;
        }
    }
}